

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

MockSpec<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
* __thiscall
testing::internal::
FunctionMocker<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
::With(FunctionMocker<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
       *this,Matcher<fmt::BasicStringRef<char>_> *m1,
      Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
      *m2,Matcher<int> *m3)

{
  _Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
  local_58;
  
  std::
  _Tuple_impl<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
  ::_Tuple_impl(&local_58,m1,m2,m3);
  std::
  _Tuple_impl<0ul,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>
  ::
  _M_assign<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>
            ((_Tuple_impl<0ul,testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>&>,testing::Matcher<int>>
              *)&(this->
                 super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
                 ).current_spec_.matchers_,&local_58);
  local_58.super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>._M_head_impl.
  super_MatcherBase<fmt::BasicStringRef<char>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028bb28;
  linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::~linked_ptr
            (&local_58.super__Head_base<0UL,_testing::Matcher<fmt::BasicStringRef<char>_>,_false>.
              _M_head_impl.super_MatcherBase<fmt::BasicStringRef<char>_>.impl_);
  local_58.
  super__Tuple_impl<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
  .
  super__Head_base<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028eff0;
  linked_ptr<const_testing::MatcherInterface<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>_>
  ::~linked_ptr(&local_58.
                 super__Tuple_impl<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
                 .
                 super__Head_base<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_false>
                 ._M_head_impl.
                 super_MatcherBase<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>
                 .impl_);
  local_58.
  super__Tuple_impl<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
  .super__Tuple_impl<2UL,_testing::Matcher<int>_>.
  super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0028a540;
  linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&local_58.
                     super__Tuple_impl<1UL,_testing::Matcher<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
                     .super__Tuple_impl<2UL,_testing::Matcher<int>_>.
                     super__Head_base<2UL,_testing::Matcher<int>,_false>._M_head_impl.
                     super_MatcherBase<int> + 8));
  return &(this->
          super_FunctionMockerBase<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_&,_int)>
          ).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2,
      const Matcher<A3>& m3) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2, m3));
    return this->current_spec();
  }